

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O2

void setDataObject_c(char *name,char *type,void *value)

{
  MockSupport *this;
  SimpleString SStack_38;
  SimpleString local_28;
  
  this = currentMockSupport;
  SimpleString::SimpleString(&local_28,name);
  SimpleString::SimpleString(&SStack_38,type);
  MockSupport::setDataObject(this,&local_28,&SStack_38,value);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

void setDataObject_c(const char* name, const char* type, void* value)
{
    currentMockSupport->setDataObject(name, type, value);
}